

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_insert_common(lyd_node *parent,lyd_node **sibling,lyd_node *node,int invalidate)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  lys_node *plVar6;
  lys_node *plVar7;
  ly_set *set;
  lys_node_list *plVar8;
  lyd_node *plVar9;
  lys_module *module;
  lyd_node **pplVar10;
  lyd_node *plVar11;
  lyd_node *plVar12;
  lyd_node *plVar13;
  LYS_NODE LVar14;
  lyd_node *plVar15;
  uint uVar16;
  char *pcVar17;
  char *pcVar18;
  bool bVar19;
  int local_4c;
  byte local_41;
  lyd_node *plStack_40;
  uint8_t pos;
  char local_31;
  
  if (parent == (lyd_node *)0x0 && sibling == (lyd_node **)0x0) {
    __assert_fail("parent || sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x10df,
                  "int lyd_insert_common(struct lyd_node *, struct lyd_node **, struct lyd_node *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    plVar15 = *sibling;
    do {
      plStack_40 = plVar15;
      plVar15 = plStack_40->prev;
    } while (plStack_40->prev->next != (lyd_node *)0x0);
  }
  else {
    plStack_40 = parent->child;
  }
  if (plStack_40 == (lyd_node *)0x0) {
    if (parent == (lyd_node *)0x0) {
      if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
        lyd_unlink_internal(node,1);
      }
      *sibling = node;
      return 0;
    }
    plVar6 = parent->schema;
    LVar14 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
    if ((plVar6->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
      LVar14 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
    }
  }
  else {
    if (parent != (lyd_node *)0x0) {
      plVar6 = parent->schema;
      LVar14 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      if ((plVar6->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) goto LAB_0016c399;
    }
    plVar6 = lys_parent(plStack_40->schema);
    for (; LVar14 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER, plVar6 != (lys_node *)0x0
        ; plVar6 = lys_parent(plVar6)) {
      if ((plVar6->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) !=
          LYS_UNKNOWN) goto LAB_0016c399;
    }
    plVar6 = (lys_node *)0x0;
  }
LAB_0016c399:
  plVar7 = node->schema;
  do {
    plVar7 = lys_parent(plVar7);
    if (plVar7 == (lys_node *)0x0) break;
  } while ((plVar7->nodetype & LVar14) == LYS_UNKNOWN);
  if (plVar6 == plVar7) {
    local_31 = '\x01';
    local_4c = 0;
    if ((invalidate != 0) &&
       ((iVar4 = lyp_is_rpc_action(node->schema), parent == (lyd_node *)0x0 ||
        (iVar4 != 0 || node->parent != parent)))) {
      local_4c = iVar4 + 1;
      local_31 = iVar4 == 0;
    }
    if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
      lyd_unlink_internal(node,local_4c);
    }
    set = ly_set_new();
    bVar3 = false;
LAB_0016c4b8:
    plVar15 = node;
    if (plVar15 != (lyd_node *)0x0) {
      node = plVar15->next;
      if ((local_4c != 1) ||
         (iVar4 = lyv_multicases(plVar15,(lys_node *)0x0,&stack0xffffffffffffffc0,1,(lyd_node *)0x0)
         , iVar4 == 0)) {
        plVar15->prev = plVar15;
        plVar15->next = (lyd_node *)0x0;
        if ((plVar15->field_0x9 & 1) == 0) {
          bVar3 = true;
          if ((((lys_node_leaf *)plVar15->schema)->nodetype != LYS_LEAF) ||
             (plVar8 = lys_is_key((lys_node_leaf *)plVar15->schema,&local_41),
             plVar8 == (lys_node_list *)0x0)) goto LAB_0016c5c7;
          plVar9 = parent->child;
          bVar19 = plVar9 != (lyd_node *)0x0;
          if ((local_41 != 0 && bVar19) && (plVar9->schema->nodetype == LYS_LEAF)) {
            uVar16 = 1;
            do {
              plVar9 = plVar9->next;
              bVar19 = plVar9 != (lyd_node *)0x0;
              if ((plVar9 == (lyd_node *)0x0) || (local_41 <= uVar16)) break;
              uVar16 = uVar16 + 1;
            } while (plVar9->schema->nodetype == LYS_LEAF);
          }
          if (!bVar19) goto LAB_0016c6da;
          if (parent->child == plVar9) {
            parent->child = plVar15;
          }
          plVar11 = plVar9->prev;
          if (plVar11->next != (lyd_node *)0x0) {
            plVar11->next = plVar15;
          }
          plVar15->prev = plVar11;
          plVar9->prev = plVar15;
          plVar15->next = plVar9;
          if (parent->child != plStack_40) {
            plStack_40 = parent->child;
          }
LAB_0016c8a1:
          bVar19 = false;
        }
        else {
LAB_0016c5c7:
          plVar6 = plVar15->schema;
          LVar14 = plVar6->nodetype;
          if (LVar14 == LYS_CONTAINER) {
            lVar2._0_2_ = plVar6[1].flags;
            lVar2._2_1_ = plVar6[1].ext_size;
            lVar2._3_1_ = plVar6[1].iffeature_size;
            lVar2._4_1_ = plVar6[1].padding[0];
            lVar2._5_1_ = plVar6[1].padding[1];
            lVar2._6_1_ = plVar6[1].padding[2];
            lVar2._7_1_ = plVar6[1].padding[3];
            if (plStack_40 != (lyd_node *)0x0 && lVar2 == 0) {
LAB_0016c631:
              bVar19 = true;
              plVar9 = plStack_40;
LAB_0016c633:
              if (plVar9->schema != plVar6) goto code_r0x0016c63c;
              if (((plVar15->field_0x9 & 1) != 0) || ((plVar9->field_0x9 & 1) != 0)) {
                plVar11 = plVar15;
                if ((plVar15->parent == (lyd_node *)0x0) && (plVar15->prev->next == (lyd_node *)0x0)
                   ) {
                  for (plVar13 = plVar15->next; plVar13 != (lyd_node *)0x0; plVar13 = plVar13->next)
                  {
                    plVar11->parent = plVar9->parent;
                    plVar11 = plVar13;
                  }
                }
                else {
                  plVar15->next = (lyd_node *)0x0;
                  plVar15->prev = plVar15;
                }
                plVar13 = plVar9->parent;
                if (plVar13 != (lyd_node *)0x0) {
                  if (plVar13->child == plVar9) {
                    plVar13->child = plVar15;
                  }
                  plVar9->parent = (lyd_node *)0x0;
                }
                plVar13 = plVar9->prev;
                if (plVar13 != plVar9) {
                  if (plVar13->next != (lyd_node *)0x0) {
                    plVar13->next = plVar15;
                  }
                  plVar15->prev = plVar13;
                  plVar9->prev = plVar9;
                  plVar13 = plVar9->next;
                  if (plVar13 == (lyd_node *)0x0) {
                    plVar13 = plVar15;
                    if (plVar15->parent == (lyd_node *)0x0) {
                      do {
                        plVar12 = plVar13;
                        plVar13 = plVar12->prev;
                      } while (plVar13 != plVar9);
                      plVar12->prev = plVar11;
                    }
                    else {
                      plVar15->parent->child->prev = plVar11;
                    }
                  }
                  else {
                    plVar13->prev = plVar11;
                    plVar11->next = plVar13;
                    plVar9->next = (lyd_node *)0x0;
                  }
                }
                lyd_free_internal_r(plVar9,1);
                goto LAB_0016c8a1;
              }
              goto LAB_0016c6dc;
            }
          }
          else if (LVar14 == LYS_LEAF) {
            if (plStack_40 != (lyd_node *)0x0) goto LAB_0016c631;
          }
          else if ((LVar14 == LYS_LEAFLIST) &&
                  ((uVar16 = set->number, uVar5 = ly_set_add(set,plVar6,0), plVar9 = plStack_40,
                   uVar5 != uVar16 || ((plVar15->field_0x9 & 1) != 0)))) {
LAB_0016c64e:
            do {
              plVar11 = plVar9;
              if (plVar11 == (lyd_node *)0x0) break;
              plVar9 = plVar11->next;
              if (plVar11->schema == plVar15->schema) {
                bVar1 = plVar15->field_0x9;
                if ((bVar1 & 1) == 0) {
LAB_0016c678:
                  if ((plVar11->field_0x9 & 1) == 0) goto LAB_0016c64e;
                }
                else if (((plVar11->field_0x9 & 1) != 0) &&
                        (((plVar11->schema->flags & 1) == 0 ||
                         (iVar4 = strcmp((char *)plVar11->ht,(char *)plVar15->ht), iVar4 != 0)))) {
                  if ((bVar1 & 1) == 0) goto LAB_0016c678;
                  goto LAB_0016c64e;
                }
                if (plVar11 == plStack_40) {
                  plStack_40 = plVar9;
                }
                lyd_free_internal_r(plVar11,1);
              }
            } while( true );
          }
LAB_0016c6da:
          bVar19 = true;
        }
LAB_0016c6dc:
        if (bVar19) {
          if (plStack_40 == (lyd_node *)0x0) {
            plStack_40 = plVar15;
            if (parent != (lyd_node *)0x0) {
              parent->child = plVar15;
            }
            goto LAB_0016c8cc;
          }
          if (local_31 != '\0') {
            plVar9 = plStack_40->prev;
            plVar9->next = plVar15;
            plVar15->prev = plVar9;
            plStack_40->prev = plVar15;
            goto LAB_0016c8cc;
          }
          plVar6 = plVar15->schema->parent;
          bVar1 = *(byte *)((long)&plVar6->nodetype + 1);
          plVar9 = plStack_40;
          while (plStack_40 = plVar9, (bVar1 & 6) == 0) {
            plVar6 = lys_parent(plVar6);
            plVar9 = plStack_40;
            bVar1 = *(byte *)((long)&plVar6->nodetype + 1);
          }
          if (plVar9 != (lyd_node *)0x0) {
            plVar7 = (lys_node *)0x0;
LAB_0016c74e:
            do {
              module = lys_node_module(plVar6);
              plVar7 = lys_getnext(plVar7,plVar6,module,0);
              if ((plVar7 != (lys_node *)0x0) && (plVar9->schema != plVar7)) {
                if (plVar15->schema != plVar7) goto LAB_0016c74e;
              }
              if (plVar15->schema == plVar7) {
                if (((plVar7->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN) ||
                   (plVar9->schema != plVar7)) goto LAB_0016c85d;
                goto LAB_0016c846;
              }
              plVar9 = plVar9->next;
            } while (plVar9 != (lyd_node *)0x0);
          }
          goto LAB_0016c78a;
        }
        goto LAB_0016c8cc;
      }
      ly_set_free(set);
      goto LAB_0016c3f2;
    }
    ly_set_free(set);
    if (parent != (lyd_node *)0x0 && bVar3) {
      do {
        if ((parent->field_0x9 & 1) == 0) break;
        parent->field_0x9 = parent->field_0x9 & 0xfe;
        parent = parent->parent;
      } while (parent != (lyd_node *)0x0);
    }
    iVar4 = 0;
    if (sibling != (lyd_node **)0x0) {
      *sibling = plStack_40;
      iVar4 = 0;
    }
  }
  else {
    pcVar18 = "<top-lvl>";
    pcVar17 = "<top-lvl>";
    if (plVar6 != (lys_node *)0x0) {
      pcVar17 = plVar6->name;
    }
    if (plVar7 != (lys_node *)0x0) {
      pcVar18 = plVar7->name;
    }
    ly_log(parent->schema->module->ctx,LY_LLERR,LY_EINVAL,
           "Cannot insert, different parents (\"%s\" and \"%s\").",pcVar17,pcVar18);
LAB_0016c3f2:
    iVar4 = 1;
  }
  return iVar4;
code_r0x0016c63c:
  plVar9 = plVar9->next;
  if (plVar9 == (lyd_node *)0x0) goto LAB_0016c6dc;
  goto LAB_0016c633;
  while (plVar9 = plVar9->next, plVar9 != (lyd_node *)0x0) {
LAB_0016c846:
    if (plVar9->schema != plVar7) goto LAB_0016c85d;
  }
LAB_0016c78a:
  plVar9 = plStack_40->prev;
  plVar9->next = plVar15;
  plVar15->prev = plVar9;
  plStack_40->prev = plVar15;
  goto LAB_0016c8cc;
LAB_0016c85d:
  if (plVar9 == plStack_40) {
    pplVar10 = &parent->child;
    plStack_40 = plVar15;
    if (parent != (lyd_node *)0x0) goto LAB_0016c8b5;
  }
  else {
    pplVar10 = &plVar9->prev->next;
LAB_0016c8b5:
    *pplVar10 = plVar15;
  }
  plVar15->prev = plVar9->prev;
  plVar9->prev = plVar15;
  plVar15->next = plVar9;
LAB_0016c8cc:
  _lyd_unlink_hash(plVar15,plVar15->parent,1);
  plVar15->parent = parent;
  _lyd_insert_hash(plVar15,1);
  if (invalidate != 0) {
    check_leaf_list_backlinks(plVar15,0);
  }
  if (local_4c != 0) {
    lyd_insert_setinvalid(plVar15);
  }
  goto LAB_0016c4b8;
}

Assistant:

int
lyd_insert_common(struct lyd_node *parent, struct lyd_node **sibling, struct lyd_node *node, int invalidate)
{
    struct lys_node *par1, *par2;
    const struct lys_node *siter;
    struct lyd_node *start, *iter, *ins, *next1, *next2;
    int invalid = 0, isrpc = 0, clrdflt = 0;
    struct ly_set *llists = NULL;
    int i;
    uint8_t pos;
    int stype = LYS_INPUT | LYS_OUTPUT;

    assert(parent || sibling);

    /* get first sibling */
    if (parent) {
        start = parent->child;
    } else {
        for (start = *sibling; start->prev->next; start = start->prev);
    }

    /* check placing the node to the appropriate place according to the schema */
    if (!start) {
        if (!parent) {
            /* empty tree to insert */
            if (node->parent || node->prev->next) {
                /* unlink the node first */
                lyd_unlink_internal(node, 1);
            } /* else insert also node's siblings */
            *sibling = node;
            return EXIT_SUCCESS;
        }
        par1 = parent->schema;
        if (par1->nodetype & (LYS_RPC | LYS_ACTION)) {
            /* it is not clear if the tree being created is going to
             * be rpc (LYS_INPUT) or rpc-reply (LYS_OUTPUT) so we have to
             * compare against LYS_RPC or LYS_ACTION in par2
             */
            stype = LYS_RPC | LYS_ACTION;
        }
    } else if (parent && (parent->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
        par1 = parent->schema;
        stype = LYS_RPC | LYS_ACTION;
    } else {
        for (par1 = lys_parent(start->schema);
             par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));
             par1 = lys_parent(par1));
    }
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | stype | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        LOGERR(parent->schema->module->ctx, LY_EINVAL, "Cannot insert, different parents (\"%s\" and \"%s\").",
               (par1 ? par1->name : "<top-lvl>"), (par2 ? par2->name : "<top-lvl>"));
        return EXIT_FAILURE;
    }

    if (invalidate) {
        invalid = isrpc = lyp_is_rpc_action(node->schema);
        if (!parent || node->parent != parent || isrpc) {
            /* it is not just moving under a parent node or it is in an RPC where
             * nodes order matters, so the validation will be necessary */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* do it permanent if the parents are not exact same or if it is top-level */
        lyd_unlink_internal(node, invalid);
    }

    llists = ly_set_new();

    /* process the nodes to insert one by one */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        if (invalid == 1) {
            /* auto delete nodes from other cases, if any;
             * this is done only if node->parent != parent */
            if (lyv_multicases(ins, NULL, &start, 1, NULL)) {
                goto error;
            }
        }

        /* isolate the node to be handled separately */
        ins->prev = ins;
        ins->next = NULL;

        iter = NULL;
        if (!ins->dflt) {
            clrdflt = 1;
        }

        /* are we inserting list key? */
        if (!ins->dflt && ins->schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)ins->schema, &pos)) {
            /* yes, we have a key, get know its position */
            for (i = 0, iter = parent->child;
                    iter && i < pos && iter->schema->nodetype == LYS_LEAF;
                    i++, iter = iter->next);
            if (iter) {
                /* insert list's key to the correct position - before the iter */
                if (parent->child == iter) {
                    parent->child = ins;
                }
                if (iter->prev->next) {
                    iter->prev->next = ins;
                }
                ins->prev = iter->prev;
                iter->prev = ins;
                ins->next = iter;

                /* update start element */
                if (parent->child != start) {
                    start = parent->child;
                }
            }

            /* try to find previously present default instance to replace */
        } else if (ins->schema->nodetype == LYS_LEAFLIST) {
            i = (int)llists->number;
            if ((ly_set_add(llists, ins->schema, 0) != i) || ins->dflt) {
                /* each leaf-list must be cleared only once (except when looking for exact same existing dflt nodes) */
                LY_TREE_FOR_SAFE(start, next2, iter) {
                    if (iter->schema == ins->schema) {
                        if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                           !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                                  ((struct lyd_node_leaf_list *)ins)->value_str))))
                                || (!ins->dflt && iter->dflt)) {
                            if (iter == start) {
                                start = next2;
                            }
                            lyd_free(iter);
                        }
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF || (ins->schema->nodetype == LYS_CONTAINER
                        && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (ins->dflt || iter->dflt) {
                        /* replace existing (either explicit or default) node with the new (either explicit or default) node */
                        lyd_replace(iter, ins, 1);
                    } else {
                        /* keep both explicit nodes, let the caller solve it later */
                        iter = NULL;
                    }
                    break;
                }
            }
        }

        if (!iter) {
            if (!start) {
                /* add as the only child of the parent */
                start = ins;
                if (parent) {
                    parent->child = ins;
                }
            } else if (isrpc) {
                /* add to the specific position in rpc/rpc-reply/action */
                for (par1 = ins->schema->parent; !(par1->nodetype & (LYS_INPUT | LYS_OUTPUT)); par1 = lys_parent(par1));
                siter = NULL;
                LY_TREE_FOR(start, iter) {
                    while ((siter = lys_getnext(siter, par1, lys_node_module(par1), 0))) {
                        if (iter->schema == siter || ins->schema == siter) {
                            break;
                        }
                    }
                    if (ins->schema == siter) {
                        if ((siter->nodetype & (LYS_LEAFLIST | LYS_LIST)) && iter->schema == siter) {
                            /* we are inserting leaflist/list instance, but since there are already
                             * some instances of the same leaflist/list, we want to insert the new one
                             * as the last instance, so here we have to move on */
                            while (iter && iter->schema == siter) {
                                iter = iter->next;
                            }
                            if (!iter) {
                                break;
                            }
                        }
                        /* we have the correct place for new node (before the iter) */
                        if (iter == start) {
                            start = ins;
                            if (parent) {
                                parent->child = ins;
                            }
                        } else {
                            iter->prev->next = ins;
                        }
                        ins->prev = iter->prev;
                        iter->prev = ins;
                        ins->next = iter;

                        /* we are done */
                        break;
                    }
                }
                if (!iter) {
                    /* add as the last child of the parent */
                    start->prev->next = ins;
                    ins->prev = start->prev;
                    start->prev = ins;
                }
            } else {
                /* add as the last child of the parent */
                start->prev->next = ins;
                ins->prev = start->prev;
                start->prev = ins;
            }
        }

#ifdef LY_ENABLED_CACHE
        lyd_unlink_hash(ins, ins->parent);
#endif

        ins->parent = parent;

#ifdef LY_ENABLED_CACHE
        lyd_insert_hash(ins);
#endif

        if (invalidate) {
            check_leaf_list_backlinks(ins, 0);
        }

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }
    }
    ly_set_free(llists);

    if (clrdflt) {
        /* remove the dflt flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    if (sibling) {
        *sibling = start;
    }
    return EXIT_SUCCESS;

error:
    ly_set_free(llists);
    return EXIT_FAILURE;
}